

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_facelift.c
# Opt level: O1

REF_STATUS ref_facelift_import(REF_GRID ref_grid,char *filename)

{
  int iVar1;
  REF_GEOM pRVar2;
  REF_DBL *pRVar3;
  REF_DBL *pRVar4;
  uint uVar5;
  undefined8 uVar6;
  long lVar7;
  char *pcVar8;
  long lVar9;
  long lVar10;
  REF_GRID freeable_ref_grid;
  REF_FACELIFT ref_facelift;
  REF_DBL geom_xyz [3];
  REF_GRID local_68;
  REF_NODE local_60;
  REF_FACELIFT local_58;
  REF_FACELIFT local_50;
  REF_DBL local_48 [3];
  
  uVar5 = ref_import_by_extension(&local_68,ref_grid->mpi,filename);
  if (uVar5 == 0) {
    pRVar2 = local_68->geom;
    uVar5 = ref_geom_share_context(pRVar2,ref_grid->geom);
    if (uVar5 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c",
             0x1df,"ref_facelift_import",(ulong)uVar5,"share context");
      return uVar5;
    }
    if (pRVar2->model != (void *)0x0) {
      uVar5 = ref_egads_mark_jump_degen(local_68);
      if (uVar5 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c",
               0x1e2,"ref_facelift_import",(ulong)uVar5,"T and UV jumps; UV degen");
        return uVar5;
      }
      uVar5 = ref_geom_verify_topo(local_68);
      if (uVar5 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c",
               0x1e3,"ref_facelift_import",(ulong)uVar5,"geom topo");
        return uVar5;
      }
      uVar5 = ref_geom_verify_param(local_68);
      if (uVar5 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c",
               0x1e4,"ref_facelift_import",(ulong)uVar5,"geom param");
        return uVar5;
      }
    }
    uVar5 = ref_facelift_create(&local_50,local_68,0);
    if (uVar5 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c",
             0x1e7,"ref_facelift_import",(ulong)uVar5,"create");
      return uVar5;
    }
    ref_grid->geom->ref_facelift = local_50;
    if (local_50->displacement == (REF_DBL *)0x0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c",
             0x1c7,"ref_facelift_infer_displacement","requires indirect facelift");
      uVar5 = 1;
    }
    else {
      pRVar2 = local_50->grid->geom;
      if (0 < pRVar2->max) {
        local_60 = local_50->grid->node;
        lVar10 = 0;
        lVar9 = 0;
        local_58 = local_50;
        do {
          if (pRVar2->descr[lVar9 * 6] != -1) {
            uVar5 = ref_egads_eval(pRVar2,(REF_INT)lVar9,local_48,(REF_DBL *)0x0);
            if (uVar5 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c"
                     ,0x1ca,"ref_facelift_infer_displacement",(ulong)uVar5,"eval geom");
              goto LAB_001b68ae;
            }
            iVar1 = pRVar2->descr[lVar9 * 6 + 5];
            pRVar3 = local_60->real;
            pRVar4 = local_58->displacement;
            lVar7 = 0;
            do {
              *(double *)((long)pRVar4 + lVar7 * 8 + lVar10) =
                   pRVar3[(long)iVar1 * 0xf + lVar7] - local_48[lVar7];
              lVar7 = lVar7 + 1;
            } while (lVar7 != 3);
          }
          lVar9 = lVar9 + 1;
          lVar10 = lVar10 + 0x18;
        } while (lVar9 < pRVar2->max);
      }
      uVar5 = 0;
    }
LAB_001b68ae:
    if (uVar5 == 0) {
      return 0;
    }
    pcVar8 = "infer displacement";
    uVar6 = 0x1e9;
  }
  else {
    pcVar8 = "import";
    uVar6 = 0x1dc;
  }
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c",uVar6,
         "ref_facelift_import",(ulong)uVar5,pcVar8);
  return uVar5;
}

Assistant:

REF_FCN REF_STATUS ref_facelift_import(REF_GRID ref_grid,
                                       const char *filename) {
  REF_GRID freeable_ref_grid;
  REF_FACELIFT ref_facelift;
  REF_GEOM ref_geom;
  RSS(ref_import_by_extension(&freeable_ref_grid, ref_grid_mpi(ref_grid),
                              filename),
      "import");
  ref_geom = ref_grid_geom(freeable_ref_grid);
  RSS(ref_geom_share_context(ref_geom, ref_grid_geom(ref_grid)),
      "share context");
  if (ref_geom_model_loaded(ref_geom)) {
    RSS(ref_egads_mark_jump_degen(freeable_ref_grid),
        "T and UV jumps; UV degen");
    RSS(ref_geom_verify_topo(freeable_ref_grid), "geom topo");
    RSS(ref_geom_verify_param(freeable_ref_grid), "geom param");
  }
  RSS(ref_facelift_create(&ref_facelift, freeable_ref_grid, REF_FALSE),
      "create");
  ref_geom_facelift(ref_grid_geom(ref_grid)) = ref_facelift;
  RSS(ref_facelift_infer_displacement(ref_facelift), "infer displacement");
  return REF_SUCCESS;
}